

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormatSymbols::DecimalFormatSymbols
          (DecimalFormatSymbols *this,Locale *loc,UErrorCode *status)

{
  long lVar1;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DecimalFormatSymbols_0039bcd0;
  lVar1 = 0x10;
  do {
    *(undefined ***)((long)this + lVar1 + -8) = &PTR__UnicodeString_003a7268;
    *(undefined2 *)((long)&(this->super_UObject)._vptr_UObject + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x710);
  (this->fNoSymbol).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fNoSymbol).fUnion.fStackFields.fLengthAndFlags = 2;
  Locale::Locale(&this->locale,loc);
  this->currPattern = (char16_t *)0x0;
  lVar1 = 0x980;
  do {
    *(undefined ***)((long)this + lVar1 + -8) = &PTR__UnicodeString_003a7268;
    *(undefined2 *)((long)&(this->super_UObject)._vptr_UObject + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xa40);
  lVar1 = 0xa40;
  do {
    *(undefined ***)((long)this + lVar1 + -8) = &PTR__UnicodeString_003a7268;
    *(undefined2 *)((long)&(this->super_UObject)._vptr_UObject + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xb00);
  initialize(this,&this->locale,status,'\0',(NumberingSystem *)0x0);
  return;
}

Assistant:

DecimalFormatSymbols::DecimalFormatSymbols(const Locale& loc, UErrorCode& status)
        : UObject(), locale(loc), currPattern(NULL) {
    initialize(locale, status);
}